

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

void testCopyMultiPartFile(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  exception *e;
  int numThreads;
  string *in_stack_fffffffffffffff0;
  int randomReadCount;
  
  randomReadCount = (int)((ulong)in_RDI >> 0x20);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing copying multi-part files");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_9b2ac::testWriteCopyRead
            (unaff_retaddr_00,unaff_retaddr,randomReadCount,in_stack_fffffffffffffff0);
  anon_unknown.dwarf_9b2ac::testWriteCopyRead
            (unaff_retaddr_00,unaff_retaddr,randomReadCount,in_stack_fffffffffffffff0);
  anon_unknown.dwarf_9b2ac::testWriteCopyRead
            (unaff_retaddr_00,unaff_retaddr,randomReadCount,in_stack_fffffffffffffff0);
  anon_unknown.dwarf_9b2ac::testWriteCopyRead
            (unaff_retaddr_00,unaff_retaddr,randomReadCount,in_stack_fffffffffffffff0);
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testCopyMultiPartFile (const std::string& tempDir)
{
    try
    {
        cout << "Testing copying multi-part files" << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteCopyRead (2, 20, 10, tempDir);
        testWriteCopyRead (1, 10, 5, tempDir);
        testWriteCopyRead (5, 4, 25, tempDir);
        testWriteCopyRead (50, 1, 250, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}